

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::has_element(raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  slot_type a;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  bool bVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i match;
  char cVar25;
  char cVar29;
  char cVar30;
  char cVar31;
  
  if (this->ctrl_ != (ctrl_t *)0x0) {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar24 = hashval >> 7;
    auVar26 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar26 = pshuflw(auVar26,auVar26,0);
    uVar23 = 0;
    while( true ) {
      uVar24 = uVar24 & uVar2;
      pcVar1 = this->ctrl_ + uVar24;
      cVar5 = *pcVar1;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      cVar25 = auVar26[0];
      auVar27[0] = -(cVar25 == cVar5);
      cVar29 = auVar26[1];
      auVar27[1] = -(cVar29 == cVar6);
      cVar30 = auVar26[2];
      auVar27[2] = -(cVar30 == cVar7);
      cVar31 = auVar26[3];
      auVar27[3] = -(cVar31 == cVar8);
      auVar27[4] = -(cVar25 == cVar9);
      auVar27[5] = -(cVar29 == cVar10);
      auVar27[6] = -(cVar30 == cVar11);
      auVar27[7] = -(cVar31 == cVar12);
      auVar27[8] = -(cVar25 == cVar13);
      auVar27[9] = -(cVar29 == cVar14);
      auVar27[10] = -(cVar30 == cVar15);
      auVar27[0xb] = -(cVar31 == cVar16);
      auVar27[0xc] = -(cVar25 == cVar17);
      auVar27[0xd] = -(cVar29 == cVar18);
      auVar27[0xe] = -(cVar30 == cVar19);
      auVar27[0xf] = -(cVar31 == cVar20);
      uVar4 = (ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf;
      if (uVar4 != 0) {
        uVar22 = (uint)uVar4;
        do {
          uVar3 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          a = this->slots_[uVar3 + uVar24 & uVar2];
          bVar21 = operator==(&a->first,&elem->first);
          if ((bVar21) && (a->second == elem->second)) {
            return true;
          }
          uVar22 = uVar22 - 1 & uVar22;
        } while (uVar22 != 0);
      }
      auVar28[0] = -(cVar5 == -0x80);
      auVar28[1] = -(cVar6 == -0x80);
      auVar28[2] = -(cVar7 == -0x80);
      auVar28[3] = -(cVar8 == -0x80);
      auVar28[4] = -(cVar9 == -0x80);
      auVar28[5] = -(cVar10 == -0x80);
      auVar28[6] = -(cVar11 == -0x80);
      auVar28[7] = -(cVar12 == -0x80);
      auVar28[8] = -(cVar13 == -0x80);
      auVar28[9] = -(cVar14 == -0x80);
      auVar28[10] = -(cVar15 == -0x80);
      auVar28[0xb] = -(cVar16 == -0x80);
      auVar28[0xc] = -(cVar17 == -0x80);
      auVar28[0xd] = -(cVar18 == -0x80);
      auVar28[0xe] = -(cVar19 == -0x80);
      auVar28[0xf] = -(cVar20 == -0x80);
      if ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == -0x80)
      break;
      uVar24 = uVar24 + uVar23 + 0x10;
      uVar23 = uVar23 + 0x10;
      if (this->capacity_ <= uVar23) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>]"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }